

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_FindSupport(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Int_t *vSuppStart,int TimeOut
               )

{
  uint uVar1;
  abctime aVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vSupp;
  Vec_Wrd_t *vPats;
  uint uVar4;
  int nPats;
  uint local_64;
  Vec_Int_t *local_50;
  int local_44;
  Vec_Wrd_t *local_40;
  long local_38;
  
  aVar2 = Abc_Clock();
  local_38 = aVar2 + (long)TimeOut * 1000000;
  local_40 = (Vec_Wrd_t *)0x0;
  local_44 = 0;
  local_64 = Acb_ComputeSuppCost(vSuppStart,vWeights,iFirstDiv);
  local_50 = Vec_IntDup(vSuppStart);
  printf("Starting cost = %d.\n",(ulong)local_64);
  vPats = (Vec_Wrd_t *)0x0;
  uVar4 = 0;
  do {
    if (uVar4 == 500) {
LAB_003282c3:
      if (vPats != (Vec_Wrd_t *)0x0) {
        Acb_FindReplace(pSat,iFirstDiv,vWeights,vPats,local_44,local_50);
        free(vPats->pArray);
        free(vPats);
      }
      return local_50;
    }
    aVar2 = Abc_Clock();
    if (local_38 < aVar2) {
      printf("Timeout after %d sec.\n",(ulong)(uint)TimeOut);
      goto LAB_003282c3;
    }
    if (uVar4 == 0) {
      pVVar3 = Acb_FindSupportStart(pSat,iFirstDiv,vWeights,&local_40,&local_44);
      vPats = local_40;
    }
    else {
      pVVar3 = Acb_FindSupportNext(pSat,iFirstDiv,vWeights,vPats,&local_44);
    }
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_003282c3;
    vSupp = Acb_FindSupportMin(pSat,iFirstDiv,vPats,&local_44,pVVar3);
    Vec_IntFree(pVVar3);
    if (vSupp == (Vec_Int_t *)0x0) goto LAB_003282c3;
    uVar1 = Acb_ComputeSuppCost(vSupp,vWeights,iFirstDiv);
    pVVar3 = vSupp;
    if ((int)uVar1 < (int)local_64) {
      printf("Iter %4d:  Next cost = %5d.  ",(ulong)uVar4,(ulong)uVar1);
      puts("Updating best solution.");
      pVVar3 = local_50;
      local_64 = uVar1;
      local_50 = vSupp;
    }
    Vec_IntFree(pVVar3);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_FindSupport( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Int_t * vSuppStart, int TimeOut )
{
    abctime clkLimit = TimeOut * CLOCKS_PER_SEC + Abc_Clock();
    Vec_Wrd_t * vPats = NULL;
    int nPats = 0;
    Vec_Int_t * vSuppBest, * vSupp, * vTemp;
    int CostBest, Cost;
    int Iter;

    // find initial best
    CostBest = Acb_ComputeSuppCost( vSuppStart, vWeights, iFirstDiv );
    vSuppBest = Vec_IntDup( vSuppStart );
    printf( "Starting cost = %d.\n", CostBest );

    // iteratively find the one with the most ones in the uncovered rows
    for ( Iter = 0; Iter < 500; Iter++ )
    {
        if ( Abc_Clock() > clkLimit )
        {
            printf( "Timeout after %d sec.\n", TimeOut );
            break;
        }
        if ( Iter == 0 )
            vSupp = Acb_FindSupportStart( pSat, iFirstDiv, vWeights, &vPats, &nPats );
        else
            vSupp = Acb_FindSupportNext( pSat, iFirstDiv, vWeights, vPats, &nPats );
        if ( vSupp == NULL )
            break;
        vSupp = Acb_FindSupportMin( pSat, iFirstDiv, vPats, &nPats, vTemp = vSupp );
        Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            break;
        Cost = Acb_ComputeSuppCost( vSupp, vWeights, iFirstDiv );
        //Acb_PrintPatterns( vPats, nPats, vWeights );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            ABC_SWAP( Vec_Int_t *, vSuppBest, vSupp );
            printf( "Iter %4d:  Next cost = %5d.  ", Iter, Cost );
            printf( "Updating best solution.\n" );
        }
        Vec_IntFree( vSupp );
    }
    if ( vPats )
        Acb_FindReplace( pSat, iFirstDiv, vWeights, vPats, nPats, vSuppBest );
    //printf( "Number of patterns = %d.\n", nPats );
    Vec_WrdFreeP( &vPats );
    return vSuppBest;
}